

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlCatalogIsEmpty(xmlCatalogPtr catal)

{
  xmlCatalogEntryPtr pxVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar1 = catal->xml;
      if (pxVar1 == (xmlCatalogEntryPtr)0x0) {
        return 1;
      }
      if ((uint)(pxVar1->type + XML_CATA_REMOVED) < 2) {
        return (int)(pxVar1->children == (_xmlCatalogEntry *)0x0);
      }
    }
    else {
      if (catal->sgml == (xmlHashTablePtr)0x0) {
        return 1;
      }
      iVar2 = xmlHashSize(catal->sgml);
      iVar3 = 1;
      if (iVar2 != 0) {
        iVar3 = iVar2 >> 0x1f;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlCatalogIsEmpty(xmlCatalogPtr catal) {
    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	if (catal->xml == NULL)
	    return(1);
	if ((catal->xml->type != XML_CATA_CATALOG) &&
	    (catal->xml->type != XML_CATA_BROKEN_CATALOG))
	    return(-1);
	if (catal->xml->children == NULL)
	    return(1);
        return(0);
    } else {
	int res;

	if (catal->sgml == NULL)
	    return(1);
	res = xmlHashSize(catal->sgml);
	if (res == 0)
	    return(1);
	if (res < 0)
	    return(-1);
    }
    return(0);
}